

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gost_gost2015.c
# Opt level: O0

int gost2015_get_asn1_params
              (ASN1_TYPE *params,size_t ukm_size,uchar *iv,size_t ukm_offset,uchar *kdf_seed)

{
  int iVar1;
  GOST2015_CIPHER_PARAMS *a;
  uchar **in_RCX;
  GOST2015_CIPHER_PARAMS **in_RDX;
  int in_ESI;
  ASN1_TYPE *in_RDI;
  undefined8 *in_R8;
  uchar *p;
  GOST2015_CIPHER_PARAMS *gcp;
  int iv_len;
  char *file;
  uchar *file_00;
  undefined8 uVar2;
  int local_4;
  
  uVar2 = 0;
  file = (char *)0x0;
  memset(in_RDX,0,0x10);
  iVar1 = ASN1_TYPE_get(in_RDI);
  if (iVar1 == 0x10) {
    file_00 = ((in_RDI->value).asn1_string)->data;
    a = d2i_GOST2015_CIPHER_PARAMS(in_RDX,in_RCX,(long)in_R8);
    iVar1 = (int)((ulong)a >> 0x20);
    if (a == (GOST2015_CIPHER_PARAMS *)0x0) {
      ERR_GOST_error(iVar1,(int)a,(char *)file_00,0);
      local_4 = 0;
    }
    else if (a->ukm->length == in_ESI) {
      memcpy(in_RDX,a->ukm->data,(size_t)in_RCX);
      *in_R8 = *(undefined8 *)(a->ukm->data + (long)in_RCX);
      GOST2015_CIPHER_PARAMS_free(a);
      local_4 = 1;
    }
    else {
      ERR_GOST_error(iVar1,(int)a,(char *)file_00,0);
      GOST2015_CIPHER_PARAMS_free(a);
      local_4 = 0;
    }
  }
  else {
    ERR_GOST_error((int)((ulong)uVar2 >> 0x20),(int)uVar2,file,0);
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int gost2015_get_asn1_params(const ASN1_TYPE *params, size_t ukm_size,
    unsigned char *iv, size_t ukm_offset, unsigned char *kdf_seed)
{
    int iv_len = 16;
    GOST2015_CIPHER_PARAMS *gcp = NULL;

    unsigned char *p = NULL;

    memset(iv, 0, iv_len);

    /* Проверяем тип params */
    if (ASN1_TYPE_get(params) != V_ASN1_SEQUENCE) {
        GOSTerr(GOST_F_GOST2015_GET_ASN1_PARAMS, GOST_R_INVALID_CIPHER_PARAMS);
        return 0;
    }

    p = params->value.sequence->data;
    /* Извлекаем структуру параметров */
    gcp = d2i_GOST2015_CIPHER_PARAMS(NULL, (const unsigned char **)&p, params->value.sequence->length);
    if (gcp == NULL) {
        GOSTerr(GOST_F_GOST2015_GET_ASN1_PARAMS, GOST_R_INVALID_CIPHER_PARAMS);
        return 0;
    }

    /* Проверяем длину синхропосылки */
    if (gcp->ukm->length != (int)ukm_size) {
        GOSTerr(GOST_F_GOST2015_GET_ASN1_PARAMS, GOST_R_INVALID_CIPHER_PARAMS);
        GOST2015_CIPHER_PARAMS_free(gcp);
        return 0;
    }

    memcpy(iv, gcp->ukm->data, ukm_offset);
    memcpy(kdf_seed, gcp->ukm->data+ukm_offset, KDF_SEED_SIZE);

    GOST2015_CIPHER_PARAMS_free(gcp);
    return 1;
}